

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

Token __thiscall flow::lang::Lexer::parseString(Lexer *this,Token result)

{
  int iVar1;
  bool bVar2;
  Token TVar3;
  int iVar4;
  
  iVar1 = this->currentChar_;
  nextChar(this,true);
  (this->stringValue_)._M_string_length = 0;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  iVar4 = -1;
  while( true ) {
    bVar2 = eof(this);
    if ((bVar2) || (iVar4 != 0x5c && this->currentChar_ == iVar1)) break;
    std::__cxx11::string::push_back((char)this + -0x58);
    iVar4 = this->currentChar_;
    nextChar(this,true);
  }
  TVar3 = Unknown;
  if (this->currentChar_ == iVar1) {
    nextChar(this,true);
    TVar3 = result;
  }
  this->token_ = TVar3;
  return TVar3;
}

Assistant:

Token Lexer::parseString(Token result) {
  int delim = currentChar();
  int last = -1;

  nextChar();  // skip left delimiter
  stringValue_.clear();

  while (!eof() && (currentChar() != delim || (last == '\\'))) {
    stringValue_ += static_cast<char>(currentChar());

    last = currentChar();
    nextChar();
  }

  if (currentChar() == delim) {
    nextChar();

    return token_ = result;
  }

  return token_ = Token::Unknown;
}